

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O3

ostream * operator<<(ostream *stream,Graph *g)

{
  pointer pEVar1;
  Edge *e;
  pointer e_00;
  
  pEVar1 = (g->edges).super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (e_00 = (g->edges).super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
              super__Vector_impl_data._M_start; e_00 != pEVar1; e_00 = e_00 + 1) {
    operator<<(stream,&e_00->super_LightEdge);
    std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + (char)stream);
    std::ostream::put((char)stream);
    std::ostream::flush();
  }
  return stream;
}

Assistant:

std::ostream &operator<<(std::ostream &stream, const Graph &g) {
    for (auto &e : g.edges)
        stream << e << std::endl;
    return stream;
}